

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O1

void idx2::InverseCdf53(v3i *M3,int Iter,array<idx2::subband> *Subbands,
                       transform_info *TransformDetails,volume *Vol,bool CoarsestLevel)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  transform_info *ptVar4;
  char *__function;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  grid *pgVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [64];
  grid_iterator<signed_char> It;
  grid_iterator<signed_char> ItEnd;
  grid_iterator<double> local_b8;
  int local_7c;
  array<idx2::subband> *local_78;
  transform_info *local_70;
  grid_iterator<double> local_68;
  
  local_7c = Iter;
  if (0 < Subbands->Size) {
    local_70 = (transform_info *)&(TransformDetails->BasisNorms).WaveNorms;
    lVar6 = 0;
    auVar15 = ZEXT1664(ZEXT816(0x3ff0000000000000));
    local_78 = Subbands;
    do {
      if (lVar6 != 0 || CoarsestLevel) {
        dVar11 = auVar15._0_8_;
        pgVar8 = (grid *)((Subbands->Buffer).Data + lVar6 * 0x40);
        dVar10 = dVar11;
        if ((M3->field_0).field_0.X != 1) {
          iVar3 = (int)*(char *)((long)&pgVar8[2].super_extent.From + 3);
          if (*(char *)((long)&pgVar8[2].super_extent.From + 6) == '\0') {
            iVar3 = TransformDetails->NPasses * local_7c + iVar3;
            if (iVar3 < 0x11) {
              iVar3 = iVar3 + -1;
              ptVar4 = TransformDetails;
              goto LAB_001a34f0;
            }
          }
          else {
            iVar3 = TransformDetails->NPasses * local_7c + iVar3;
            ptVar4 = local_70;
            if (iVar3 < 0x10) {
LAB_001a34f0:
              dVar10 = (ptVar4->BasisNorms).ScalNorms.Arr[iVar3];
              goto LAB_001a34f7;
            }
          }
          goto LAB_001a3f7e;
        }
LAB_001a34f7:
        dVar13 = dVar11;
        if ((M3->field_0).field_0.Y != 1) {
          iVar3 = (int)*(char *)((long)&pgVar8[2].super_extent.From + 4);
          if (*(char *)((long)&pgVar8[2].super_extent.From + 7) == '\0') {
            iVar3 = TransformDetails->NPasses * local_7c + iVar3;
            if (iVar3 < 0x11) {
              iVar3 = iVar3 + -1;
              ptVar4 = TransformDetails;
              goto LAB_001a3547;
            }
          }
          else {
            iVar3 = TransformDetails->NPasses * local_7c + iVar3;
            ptVar4 = local_70;
            if (iVar3 < 0x10) {
LAB_001a3547:
              dVar13 = (ptVar4->BasisNorms).ScalNorms.Arr[iVar3];
              goto LAB_001a354e;
            }
          }
          goto LAB_001a3f7e;
        }
LAB_001a354e:
        dVar14 = dVar11;
        if ((M3->field_0).field_0.Z != 1) {
          iVar3 = (int)*(char *)((long)&pgVar8[2].super_extent.From + 5);
          if ((char)pgVar8[2].super_extent.Dims == '\0') {
            iVar3 = TransformDetails->NPasses * local_7c + iVar3;
            if (iVar3 < 0x11) {
              iVar3 = iVar3 + -1;
              ptVar4 = TransformDetails;
              goto LAB_001a359e;
            }
          }
          else {
            iVar3 = TransformDetails->NPasses * local_7c + iVar3;
            ptVar4 = local_70;
            if (iVar3 < 0x10) {
LAB_001a359e:
              dVar14 = (ptVar4->BasisNorms).ScalNorms.Arr[iVar3];
              goto LAB_001a35a5;
            }
          }
LAB_001a3f7e:
          __function = 
          "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]";
          goto LAB_001a3f93;
        }
LAB_001a35a5:
        if (Vol->Type < __Invalid__) {
          dVar11 = dVar11 / (dVar10 * dVar13 * dVar14);
          switch(Vol->Type) {
          case int8:
            End<signed_char>((grid_iterator<signed_char> *)&local_68,pgVar8,Vol);
            Begin<signed_char>((grid_iterator<signed_char> *)&local_b8,pgVar8,Vol);
            while (local_b8.Ptr != local_68.Ptr) {
              *(char *)local_b8.Ptr = (char)(int)(dVar11 * (double)(int)*(char *)local_b8.Ptr);
              local_b8.P.field_0.field_0.X =
                   local_b8.P.field_0.field_0.X + local_b8.S.field_0.field_0.X;
              local_b8.Ptr = (double *)((long)local_b8.S.field_0.field_0.X + (long)local_b8.Ptr);
              if (local_b8.D.field_0.field_0.X <= local_b8.P.field_0.field_0.X) {
                local_b8.P.field_0.field_0.X = 0;
                local_b8.P.field_0.field_0.Y =
                     local_b8.P.field_0.field_0.Y + local_b8.S.field_0.field_0.Y;
                lVar9 = (long)local_b8.N.field_0.field_0.X;
                local_b8.Ptr = (double *)
                               ((long)local_b8.Ptr +
                               (local_b8.S.field_0.field_0.Y * lVar9 -
                               (long)local_b8.D.field_0.field_0.X));
                if (local_b8.D.field_0.field_0.Y <= local_b8.P.field_0.field_0.Y) {
                  local_b8.P.field_0.field_0.Y = 0;
                  local_b8.P.field_0.field_0.Z =
                       local_b8.P.field_0.field_0.Z + local_b8.S.field_0.field_0.Z;
                  local_b8.Ptr = (double *)
                                 ((long)local_b8.Ptr +
                                 ((long)local_b8.N.field_0.field_0.Y *
                                  local_b8.S.field_0.field_0.Z * lVar9 -
                                 local_b8.D.field_0.field_0.Y * lVar9));
                }
              }
            }
            break;
          case uint8:
            End<unsigned_char>((grid_iterator<unsigned_char> *)&local_68,pgVar8,Vol);
            Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_b8,pgVar8,Vol);
            while (local_b8.Ptr != local_68.Ptr) {
              *(char *)local_b8.Ptr = (char)(int)(dVar11 * (double)*(byte *)local_b8.Ptr);
              local_b8.P.field_0.field_0.X =
                   local_b8.P.field_0.field_0.X + local_b8.S.field_0.field_0.X;
              local_b8.Ptr = (double *)((long)local_b8.S.field_0.field_0.X + (long)local_b8.Ptr);
              if (local_b8.D.field_0.field_0.X <= local_b8.P.field_0.field_0.X) {
                local_b8.P.field_0.field_0.X = 0;
                local_b8.P.field_0.field_0.Y =
                     local_b8.P.field_0.field_0.Y + local_b8.S.field_0.field_0.Y;
                lVar9 = (long)local_b8.N.field_0.field_0.X;
                local_b8.Ptr = (double *)
                               ((long)local_b8.Ptr +
                               (local_b8.S.field_0.field_0.Y * lVar9 -
                               (long)local_b8.D.field_0.field_0.X));
                if (local_b8.D.field_0.field_0.Y <= local_b8.P.field_0.field_0.Y) {
                  local_b8.P.field_0.field_0.Y = 0;
                  local_b8.P.field_0.field_0.Z =
                       local_b8.P.field_0.field_0.Z + local_b8.S.field_0.field_0.Z;
                  local_b8.Ptr = (double *)
                                 ((long)local_b8.Ptr +
                                 ((long)local_b8.N.field_0.field_0.Y *
                                  local_b8.S.field_0.field_0.Z * lVar9 -
                                 local_b8.D.field_0.field_0.Y * lVar9));
                }
              }
            }
            break;
          case int16:
            End<short>((grid_iterator<short> *)&local_68,pgVar8,Vol);
            Begin<short>((grid_iterator<short> *)&local_b8,pgVar8,Vol);
            while (local_b8.Ptr != local_68.Ptr) {
              *(short *)local_b8.Ptr = (short)(int)(dVar11 * (double)(int)*(short *)local_b8.Ptr);
              local_b8.P.field_0.field_0.X =
                   local_b8.P.field_0.field_0.X + local_b8.S.field_0.field_0.X;
              local_b8.Ptr = (double *)((long)local_b8.Ptr + (long)local_b8.S.field_0.field_0.X * 2)
              ;
              if (local_b8.D.field_0.field_0.X <= local_b8.P.field_0.field_0.X) {
                local_b8.P.field_0.field_0.X = 0;
                local_b8.P.field_0.field_0.Y =
                     local_b8.P.field_0.field_0.Y + local_b8.S.field_0.field_0.Y;
                lVar9 = (long)local_b8.N.field_0.field_0.X;
                local_b8.Ptr = (double *)
                               ((long)local_b8.Ptr +
                               local_b8.S.field_0.field_0.Y * lVar9 * 2 +
                               (long)local_b8.D.field_0.field_0.X * -2);
                if (local_b8.D.field_0.field_0.Y <= local_b8.P.field_0.field_0.Y) {
                  local_b8.P.field_0.field_0.Y = 0;
                  local_b8.P.field_0.field_0.Z =
                       local_b8.P.field_0.field_0.Z + local_b8.S.field_0.field_0.Z;
                  local_b8.Ptr = (double *)
                                 ((long)local_b8.Ptr +
                                 (long)local_b8.N.field_0.field_0.Y *
                                 local_b8.S.field_0.field_0.Z * lVar9 * 2 +
                                 local_b8.D.field_0.field_0.Y * lVar9 * -2);
                }
              }
            }
            break;
          case uint16:
            End<unsigned_short>((grid_iterator<unsigned_short> *)&local_68,pgVar8,Vol);
            Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_b8,pgVar8,Vol);
            while (local_b8.Ptr != local_68.Ptr) {
              *(short *)local_b8.Ptr = (short)(int)(dVar11 * (double)*(ushort *)local_b8.Ptr);
              local_b8.P.field_0.field_0.X =
                   local_b8.P.field_0.field_0.X + local_b8.S.field_0.field_0.X;
              local_b8.Ptr = (double *)((long)local_b8.Ptr + (long)local_b8.S.field_0.field_0.X * 2)
              ;
              if (local_b8.D.field_0.field_0.X <= local_b8.P.field_0.field_0.X) {
                local_b8.P.field_0.field_0.X = 0;
                local_b8.P.field_0.field_0.Y =
                     local_b8.P.field_0.field_0.Y + local_b8.S.field_0.field_0.Y;
                lVar9 = (long)local_b8.N.field_0.field_0.X;
                local_b8.Ptr = (double *)
                               ((long)local_b8.Ptr +
                               local_b8.S.field_0.field_0.Y * lVar9 * 2 +
                               (long)local_b8.D.field_0.field_0.X * -2);
                if (local_b8.D.field_0.field_0.Y <= local_b8.P.field_0.field_0.Y) {
                  local_b8.P.field_0.field_0.Y = 0;
                  local_b8.P.field_0.field_0.Z =
                       local_b8.P.field_0.field_0.Z + local_b8.S.field_0.field_0.Z;
                  local_b8.Ptr = (double *)
                                 ((long)local_b8.Ptr +
                                 (long)local_b8.N.field_0.field_0.Y *
                                 local_b8.S.field_0.field_0.Z * lVar9 * 2 +
                                 local_b8.D.field_0.field_0.Y * lVar9 * -2);
                }
              }
            }
            break;
          case int32:
            End<int>((grid_iterator<int> *)&local_68,pgVar8,Vol);
            Begin<int>((grid_iterator<int> *)&local_b8,pgVar8,Vol);
            while (local_b8.Ptr != local_68.Ptr) {
              *(int *)local_b8.Ptr = (int)(dVar11 * (double)(int)*(float *)local_b8.Ptr);
              local_b8.P.field_0.field_0.X =
                   local_b8.P.field_0.field_0.X + local_b8.S.field_0.field_0.X;
              local_b8.Ptr = (double *)((long)local_b8.Ptr + (long)local_b8.S.field_0.field_0.X * 4)
              ;
              if (local_b8.D.field_0.field_0.X <= local_b8.P.field_0.field_0.X) {
                local_b8.P.field_0.field_0.X = 0;
                local_b8.P.field_0.field_0.Y =
                     local_b8.P.field_0.field_0.Y + local_b8.S.field_0.field_0.Y;
                lVar9 = (long)local_b8.N.field_0.field_0.X;
                local_b8.Ptr = (double *)
                               ((long)local_b8.Ptr +
                               local_b8.S.field_0.field_0.Y * lVar9 * 4 +
                               (long)local_b8.D.field_0.field_0.X * -4);
                if (local_b8.D.field_0.field_0.Y <= local_b8.P.field_0.field_0.Y) {
                  local_b8.P.field_0.field_0.Y = 0;
                  local_b8.P.field_0.field_0.Z =
                       local_b8.P.field_0.field_0.Z + local_b8.S.field_0.field_0.Z;
                  local_b8.Ptr = (double *)
                                 ((long)local_b8.Ptr +
                                 (long)local_b8.N.field_0.field_0.Y *
                                 local_b8.S.field_0.field_0.Z * lVar9 * 4 +
                                 local_b8.D.field_0.field_0.Y * lVar9 * -4);
                }
              }
            }
            break;
          case uint32:
            End<unsigned_int>((grid_iterator<unsigned_int> *)&local_68,pgVar8,Vol);
            Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_b8,pgVar8,Vol);
            while (local_b8.Ptr != local_68.Ptr) {
              *(float *)local_b8.Ptr = (float)(long)(dVar11 * (double)(uint)*(float *)local_b8.Ptr);
              local_b8.P.field_0.field_0.X =
                   local_b8.P.field_0.field_0.X + local_b8.S.field_0.field_0.X;
              local_b8.Ptr = (double *)((long)local_b8.Ptr + (long)local_b8.S.field_0.field_0.X * 4)
              ;
              if (local_b8.D.field_0.field_0.X <= local_b8.P.field_0.field_0.X) {
                local_b8.P.field_0.field_0.X = 0;
                local_b8.P.field_0.field_0.Y =
                     local_b8.P.field_0.field_0.Y + local_b8.S.field_0.field_0.Y;
                lVar9 = (long)local_b8.N.field_0.field_0.X;
                local_b8.Ptr = (double *)
                               ((long)local_b8.Ptr +
                               local_b8.S.field_0.field_0.Y * lVar9 * 4 +
                               (long)local_b8.D.field_0.field_0.X * -4);
                if (local_b8.D.field_0.field_0.Y <= local_b8.P.field_0.field_0.Y) {
                  local_b8.P.field_0.field_0.Y = 0;
                  local_b8.P.field_0.field_0.Z =
                       local_b8.P.field_0.field_0.Z + local_b8.S.field_0.field_0.Z;
                  local_b8.Ptr = (double *)
                                 ((long)local_b8.Ptr +
                                 (long)local_b8.N.field_0.field_0.Y *
                                 local_b8.S.field_0.field_0.Z * lVar9 * 4 +
                                 local_b8.D.field_0.field_0.Y * lVar9 * -4);
                }
              }
            }
            break;
          case int64:
            End<long>((grid_iterator<long> *)&local_68,pgVar8,Vol);
            Begin<long>((grid_iterator<long> *)&local_b8,pgVar8,Vol);
            while (local_b8.Ptr != local_68.Ptr) {
              *local_b8.Ptr = (double)(long)(dVar11 * (double)(long)*local_b8.Ptr);
              local_b8.P.field_0.field_0.X =
                   local_b8.P.field_0.field_0.X + local_b8.S.field_0.field_0.X;
              local_b8.Ptr = local_b8.Ptr + local_b8.S.field_0.field_0.X;
              if (local_b8.D.field_0.field_0.X <= local_b8.P.field_0.field_0.X) {
                local_b8.P.field_0.field_0.X = 0;
                local_b8.P.field_0.field_0.Y =
                     local_b8.P.field_0.field_0.Y + local_b8.S.field_0.field_0.Y;
                lVar9 = (long)local_b8.N.field_0.field_0.X;
                local_b8.Ptr = local_b8.Ptr +
                               (local_b8.S.field_0.field_0.Y * lVar9 -
                               (long)local_b8.D.field_0.field_0.X);
                if (local_b8.D.field_0.field_0.Y <= local_b8.P.field_0.field_0.Y) {
                  local_b8.P.field_0.field_0.Y = 0;
                  local_b8.P.field_0.field_0.Z =
                       local_b8.P.field_0.field_0.Z + local_b8.S.field_0.field_0.Z;
                  local_b8.Ptr = local_b8.Ptr +
                                 ((long)local_b8.N.field_0.field_0.Y *
                                  local_b8.S.field_0.field_0.Z * lVar9 -
                                 local_b8.D.field_0.field_0.Y * lVar9);
                }
              }
            }
            break;
          case uint64:
            End<unsigned_long>((grid_iterator<unsigned_long> *)&local_68,pgVar8,Vol);
            Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_b8,pgVar8,Vol);
            auVar2 = _DAT_001bdf20;
            while (local_b8.Ptr != local_68.Ptr) {
              auVar12._8_8_ = 0;
              auVar12._0_8_ = *local_b8.Ptr;
              auVar12 = vunpcklps_avx(auVar12,ZEXT816(0x4530000043300000));
              auVar12 = vsubpd_avx(auVar12,auVar2);
              dVar10 = dVar11 * (auVar12._0_8_ + auVar12._8_8_);
              uVar5 = (ulong)dVar10;
              *local_b8.Ptr =
                   (double)((long)(dVar10 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5);
              local_b8.P.field_0.field_0.X =
                   local_b8.P.field_0.field_0.X + local_b8.S.field_0.field_0.X;
              local_b8.Ptr = local_b8.Ptr + local_b8.S.field_0.field_0.X;
              if (local_b8.D.field_0.field_0.X <= local_b8.P.field_0.field_0.X) {
                local_b8.P.field_0.field_0.X = 0;
                local_b8.P.field_0.field_0.Y =
                     local_b8.P.field_0.field_0.Y + local_b8.S.field_0.field_0.Y;
                lVar9 = (long)local_b8.N.field_0.field_0.X;
                local_b8.Ptr = local_b8.Ptr +
                               (local_b8.S.field_0.field_0.Y * lVar9 -
                               (long)local_b8.D.field_0.field_0.X);
                if (local_b8.D.field_0.field_0.Y <= local_b8.P.field_0.field_0.Y) {
                  local_b8.P.field_0.field_0.Y = 0;
                  local_b8.P.field_0.field_0.Z =
                       local_b8.P.field_0.field_0.Z + local_b8.S.field_0.field_0.Z;
                  local_b8.Ptr = local_b8.Ptr +
                                 ((long)local_b8.N.field_0.field_0.Y *
                                  local_b8.S.field_0.field_0.Z * lVar9 -
                                 local_b8.D.field_0.field_0.Y * lVar9);
                }
              }
            }
            break;
          case float32:
            End<float>((grid_iterator<float> *)&local_68,pgVar8,Vol);
            Begin<float>((grid_iterator<float> *)&local_b8,pgVar8,Vol);
            while (local_b8.Ptr != local_68.Ptr) {
              *(float *)local_b8.Ptr = (float)(dVar11 * (double)*(float *)local_b8.Ptr);
              local_b8.P.field_0.field_0.X =
                   local_b8.P.field_0.field_0.X + local_b8.S.field_0.field_0.X;
              local_b8.Ptr = (double *)((long)local_b8.Ptr + (long)local_b8.S.field_0.field_0.X * 4)
              ;
              if (local_b8.D.field_0.field_0.X <= local_b8.P.field_0.field_0.X) {
                local_b8.P.field_0.field_0.X = 0;
                local_b8.P.field_0.field_0.Y =
                     local_b8.P.field_0.field_0.Y + local_b8.S.field_0.field_0.Y;
                lVar9 = (long)local_b8.N.field_0.field_0.X;
                local_b8.Ptr = (double *)
                               ((long)local_b8.Ptr +
                               local_b8.S.field_0.field_0.Y * lVar9 * 4 +
                               (long)local_b8.D.field_0.field_0.X * -4);
                if (local_b8.D.field_0.field_0.Y <= local_b8.P.field_0.field_0.Y) {
                  local_b8.P.field_0.field_0.Y = 0;
                  local_b8.P.field_0.field_0.Z =
                       local_b8.P.field_0.field_0.Z + local_b8.S.field_0.field_0.Z;
                  local_b8.Ptr = (double *)
                                 ((long)local_b8.Ptr +
                                 (long)local_b8.N.field_0.field_0.Y *
                                 local_b8.S.field_0.field_0.Z * lVar9 * 4 +
                                 local_b8.D.field_0.field_0.Y * lVar9 * -4);
                }
              }
            }
            break;
          case float64:
            End<double>(&local_68,pgVar8,Vol);
            Begin<double>(&local_b8,pgVar8,Vol);
            while (local_b8.Ptr != local_68.Ptr) {
              *local_b8.Ptr = dVar11 * *local_b8.Ptr;
              local_b8.P.field_0.field_0.X =
                   local_b8.P.field_0.field_0.X + local_b8.S.field_0.field_0.X;
              local_b8.Ptr = local_b8.Ptr + local_b8.S.field_0.field_0.X;
              if (local_b8.D.field_0.field_0.X <= local_b8.P.field_0.field_0.X) {
                local_b8.P.field_0.field_0.X = 0;
                local_b8.P.field_0.field_0.Y =
                     local_b8.P.field_0.field_0.Y + local_b8.S.field_0.field_0.Y;
                lVar9 = (long)local_b8.N.field_0.field_0.X;
                local_b8.Ptr = local_b8.Ptr +
                               (local_b8.S.field_0.field_0.Y * lVar9 -
                               (long)local_b8.D.field_0.field_0.X);
                if (local_b8.D.field_0.field_0.Y <= local_b8.P.field_0.field_0.Y) {
                  local_b8.P.field_0.field_0.Y = 0;
                  local_b8.P.field_0.field_0.Z =
                       local_b8.P.field_0.field_0.Z + local_b8.S.field_0.field_0.Z;
                  local_b8.Ptr = local_b8.Ptr +
                                 ((long)local_b8.N.field_0.field_0.Y *
                                  local_b8.S.field_0.field_0.Z * lVar9 -
                                 local_b8.D.field_0.field_0.Y * lVar9);
                }
              }
            }
          }
          auVar15 = ZEXT1664(ZEXT816(0x3ff0000000000000));
          Subbands = local_78;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < Subbands->Size);
  }
  iVar3 = TransformDetails->StackSize;
  lVar6 = (long)iVar3;
  if (0 < lVar6) {
    lVar9 = lVar6 + 1;
    piVar7 = (TransformDetails->StackAxes).Arr + lVar6 + -1;
    pgVar8 = (TransformDetails->StackGrids).Arr + lVar6 + -1;
    do {
      if (0x20 < iVar3) {
        __function = "t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]";
LAB_001a3f93:
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,__function);
      }
      if (Vol->Type < __Invalid__) {
        iVar1 = *piVar7;
        if (iVar1 == 2) {
          ILiftCdf53Z<double>(pgVar8,M3,Normal,Vol);
        }
        else if (iVar1 == 1) {
          ILiftCdf53Y<double>(pgVar8,M3,Normal,Vol);
        }
        else if (iVar1 == 0) {
          ILiftCdf53X<double>(pgVar8,M3,Normal,Vol);
        }
      }
      lVar9 = lVar9 + -1;
      piVar7 = piVar7 + -1;
      pgVar8 = pgVar8 + -1;
    } while (1 < lVar9);
  }
  return;
}

Assistant:

void
InverseCdf53(const v3i& M3,
             int Iter,
             const array<subband>& Subbands,
             const transform_info& TransformDetails,
             volume* Vol,
             bool CoarsestLevel)
{
  /* inverse normalize if required */
  idx2_Assert(IsFloatingPoint(Vol->Type));
  for (int I = 0; I < Size(Subbands); ++I)
  {
    if (I == 0 && !CoarsestLevel)
      continue; // do not normalize subband 0
    subband& S = Subbands[I];
    f64 Wx = M3.X == 1
               ? 1
               : (S.LowHigh3.X == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X]);
    f64 Wy = M3.Y == 1
               ? 1
               : (S.LowHigh3.Y == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y]);
    f64 Idx2 = M3.Z == 1 ? 1
                         : (S.LowHigh3.Z == 0
                              ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z - 1]
                              : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z]);
    f64 W = 1.0 / (Wx * Wy * Idx2);
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }

  /* perform the inverse transform */
  int I = TransformDetails.StackSize;
  while (I-- > 0)
  {
    int D = TransformDetails.StackAxes[I];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      ILiftCdf53X<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    case 1:                                                                                        \
      ILiftCdf53Y<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    case 2:                                                                                        \
      ILiftCdf53Z<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}